

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::PageHeapData::~PageHeapData(PageHeapData *this)

{
  PageHeapData *this_local;
  
  if (this->pageHeapAllocStack != (StackBackTrace *)0x0) {
    if (this->pageHeapAllocStack != s_StackTraceAllocFailed) {
      StackBackTrace::Delete<Memory::NoThrowHeapAllocator>
                (this->pageHeapAllocStack,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
    }
    this->pageHeapAllocStack = (StackBackTrace *)0x0;
  }
  if (this->pageHeapFreeStack != (StackBackTrace *)0x0) {
    StackBackTrace::Delete<Memory::NoThrowHeapAllocator>
              (this->pageHeapFreeStack,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
    this->pageHeapFreeStack = (StackBackTrace *)0x0;
  }
  return;
}

Assistant:

PageHeapData::~PageHeapData()
{
#ifdef STACK_BACK_TRACE
    if (this->pageHeapAllocStack != nullptr)
    {
        if (this->pageHeapAllocStack != PageHeapData::s_StackTraceAllocFailed)
        {
            this->pageHeapAllocStack->Delete(&NoThrowHeapAllocator::Instance);
        }
        this->pageHeapAllocStack = nullptr;
    }

    // REVIEW: This means that the old free stack is lost when we get free the heap block
    // Is this okay? Should we delay freeing heap blocks till process/thread shutdown time?
    if (this->pageHeapFreeStack != nullptr)
    {
        this->pageHeapFreeStack->Delete(&NoThrowHeapAllocator::Instance);
        this->pageHeapFreeStack = nullptr;
    }
#endif
}